

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DReconfigurationRejectedTest::iterate
          (MultisampleTextureTexStorage2DReconfigurationRejectedTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar4;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_storage_multisample_2d_array_supported = bVar1;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&this->to_id_2d,0x9100);
  if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&this->to_id_2d_array,0x9102);
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1390))(0x9100,2,0x8058,4,4,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,
                  "glTexStorage2DMultisample() failed to set up immutable 2D multisample texture object"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x279);
  (**(code **)(lVar4 + 0x1390))(0x9100,2,0x8058,4,4,1);
  iVar2 = (**(code **)(lVar4 + 0x800))();
  if (iVar2 == 0x502) {
    if (this->gl_oes_texture_storage_multisample_2d_array_supported != '\0') {
      (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,4,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,
                      "gltexStorage3DMultisample() failed to set up immutable 2D array multisample texture object"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                      ,0x28b);
      (**(code **)(lVar4 + 0x13a8))(0x9102,2,0x8058,4,4,4,1);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x502) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid error code reported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                   ,0x293);
        goto LAB_00bfac6b;
      }
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid error code reported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
             ,0x280);
LAB_00bfac6b:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DReconfigurationRejectedTest::iterate()
{
	gl_oes_texture_storage_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	initInternals();

	/* Test case variables */
	const glw::GLsizei   depth				  = 4;
	const glw::GLboolean fixedsamplelocations = GL_TRUE;
	const glw::GLsizei   height				  = 4;
	const glw::GLenum	internalformat		  = GL_RGBA8;
	const glw::GLsizei   samples			  = 2;
	const glw::GLsizei   width				  = 4;

	/* Set up immutable 2D multisample texture object */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, width, height, fixedsamplelocations);

	GLU_EXPECT_NO_ERROR(gl.getError(),
						"glTexStorage2DMultisample() failed to set up immutable 2D multisample texture object");

	/* Try to reset immutable 2D multisample texture object */
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, width, height, fixedsamplelocations);

	if (gl.getError() != GL_INVALID_OPERATION)
	{
		TCU_FAIL("Invalid error code reported");
	}

	if (gl_oes_texture_storage_multisample_2d_array_supported)
	{
		/* Set up immutable 2D array multisample texture object */
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, samples, internalformat, width, height, depth,
								   fixedsamplelocations);

		GLU_EXPECT_NO_ERROR(
			gl.getError(),
			"gltexStorage3DMultisample() failed to set up immutable 2D array multisample texture object");

		/* Try to reset immutable 2D array multisample texture object */
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, samples, internalformat, width, height, depth,
								   fixedsamplelocations);

		if (gl.getError() != GL_INVALID_OPERATION)
		{
			TCU_FAIL("Invalid error code reported");
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}